

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_lite.h
# Opt level: O3

void __thiscall
proto2_unittest::TestDeprecatedLite::InternalSwap
          (TestDeprecatedLite *this,TestDeprecatedLite *other)

{
  uint32_t uVar1;
  ulong uVar2;
  ulong uVar3;
  void *pvVar4;
  TestDeprecatedLite *pTVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  ulong uVar8;
  ulong uVar9;
  long __tmp;
  
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  uVar8 = uVar2;
  if ((uVar2 & 1) != 0) {
    uVar8 = *(ulong *)(uVar2 & 0xfffffffffffffffe);
  }
  uVar3 = (other->super_MessageLite)._internal_metadata_.ptr_;
  uVar9 = uVar3;
  if ((uVar3 & 1) != 0) {
    uVar9 = *(ulong *)(uVar3 & 0xfffffffffffffffe);
  }
  if (uVar8 == uVar9) {
    (this->super_MessageLite)._internal_metadata_.ptr_ = uVar3;
    (other->super_MessageLite)._internal_metadata_.ptr_ = uVar2;
    uVar1 = (this->field_0)._impl_._has_bits_.has_bits_[0];
    (this->field_0)._impl_._has_bits_.has_bits_[0] = (other->field_0)._impl_._has_bits_.has_bits_[0]
    ;
    (other->field_0)._impl_._has_bits_.has_bits_[0] = uVar1;
    pvVar4 = (other->field_0)._impl_.deprecated_field3_.tagged_ptr_.ptr_;
    (other->field_0)._impl_.deprecated_field3_.tagged_ptr_.ptr_ =
         (this->field_0)._impl_.deprecated_field3_.tagged_ptr_.ptr_;
    (this->field_0)._impl_.deprecated_field3_.tagged_ptr_.ptr_ = pvVar4;
    pTVar5 = (this->field_0)._impl_.deprecated_field4_;
    uVar6 = *(undefined8 *)((long)&this->field_0 + 0x18);
    uVar7 = *(undefined8 *)((long)&other->field_0 + 0x18);
    (this->field_0)._impl_.deprecated_field4_ = (other->field_0)._impl_.deprecated_field4_;
    *(undefined8 *)((long)&this->field_0 + 0x18) = uVar7;
    (other->field_0)._impl_.deprecated_field4_ = pTVar5;
    *(undefined8 *)((long)&other->field_0 + 0x18) = uVar6;
    return;
  }
  InternalSwap();
}

Assistant:

PROTOBUF_ALWAYS_INLINE bool HasUnknownFieldsTag() const {
    return ptr_ & kUnknownFieldsTagMask;
  }